

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

void __thiscall fmp4_stream::tfhd::print(tfhd *this)

{
  _Setw _Var1;
  ostream *poVar2;
  void *pvVar3;
  tfhd *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"=================tfhd==================");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  poVar2 = std::operator<<(poVar2," vflags                  ");
  pvVar3 = (void *)std::ostream::operator<<
                             (poVar2,*(uint *)&(this->super_full_box).super_box.field_0x64);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  poVar2 = std::operator<<(poVar2," track id:                  ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,this->track_id_);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  if (((this->super_full_box).field_0x6c & 1) != 0) {
    _Var1 = std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
    poVar2 = std::operator<<(poVar2," base_data_offset: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,this->base_data_offset_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  if (((this->super_full_box).field_0x6d & 1) != 0) {
    _Var1 = std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
    poVar2 = std::operator<<(poVar2," sample description: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,this->sample_description_index_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  if (((this->super_full_box).field_0x6e & 1) != 0) {
    _Var1 = std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
    poVar2 = std::operator<<(poVar2," default sample duration: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,this->default_sample_duration_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  if (((this->super_full_box).field_0x6f & 1) != 0) {
    _Var1 = std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
    poVar2 = std::operator<<(poVar2," default sample size: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,this->default_sample_size_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  if ((this->default_sample_flags_present_ & 1U) != 0) {
    _Var1 = std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
    poVar2 = std::operator<<(poVar2," default sample flags:  ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,this->default_sample_flags_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  _Var1 = std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  poVar2 = std::operator<<(poVar2," duration is empty ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,(bool)(this->duration_is_empty_ & 1));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  poVar2 = std::operator<<(poVar2," default base is moof");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,(bool)(this->default_base_is_moof_ & 1));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void tfhd::print() const {
		std::cout << "=================tfhd==================" << std::endl;
		//cout << setw(33) << left << " magic conf                 " << m_magic_conf << endl;
		std::cout << std::setw(33) << std::left << " vflags                  " << flags_ << std::endl;
		std::cout << std::setw(33) << std::left << " track id:                  " << track_id_ << std::endl;
		if (base_data_offset_present_)
			std::cout << std::setw(33) << std::left << " base_data_offset: " << base_data_offset_ << std::endl;
		if (sample_description_index_present_)
			std::cout << std::setw(33) << std::left << " sample description: " << sample_description_index_ << std::endl;
		if (default_sample_duration_present_)
			std::cout << std::setw(33) << std::left << " default sample duration: " << default_sample_duration_ << std::endl;
		if (default_sample_size_present_)
			std::cout << std::setw(33) << std::left << " default sample size: " << default_sample_size_ << std::endl;
		if (default_sample_flags_present_)
			std::cout << std::setw(33) << std::left << " default sample flags:  " << default_sample_flags_ << std::endl;
		std::cout << std::setw(33) << std::left << " duration is empty " << duration_is_empty_ << std::endl;
		std::cout << std::setw(33) << std::left << " default base is moof" << default_base_is_moof_ << std::endl;
		//cout << "............." << std::endl;
	}